

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramUniformTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_1::UniformCollection::~UniformCollection
          (UniformCollection *this)

{
  StructType *this_00;
  pointer pUVar1;
  long *plVar2;
  pointer ppSVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  pointer pUVar5;
  long lVar6;
  
  ppSVar3 = (this->m_structTypes).
            super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->m_structTypes).
                              super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar3) >> 3)) {
    lVar6 = 0;
    do {
      this_00 = ppSVar3[lVar6];
      if (this_00 != (StructType *)0x0) {
        glu::StructType::~StructType(this_00);
      }
      operator_delete(this_00,0x38);
      lVar6 = lVar6 + 1;
      ppSVar3 = (this->m_structTypes).
                super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (lVar6 < (int)((ulong)((long)(this->m_structTypes).
                                         super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar3)
                          >> 3));
  }
  if (ppSVar3 != (pointer)0x0) {
    operator_delete(ppSVar3,(long)(this->m_structTypes).
                                  super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppSVar3
                   );
  }
  pUVar5 = (this->m_uniforms).
           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pUVar1 = (this->m_uniforms).
           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pUVar5 != pUVar1) {
    paVar4 = &(pUVar5->name).field_2;
    do {
      glu::VarType::~VarType((VarType *)(paVar4 + 1));
      plVar2 = (long *)(((string *)(paVar4 + -1))->_M_dataplus)._M_p;
      if (paVar4 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)plVar2) {
        operator_delete(plVar2,paVar4->_M_allocated_capacity + 1);
      }
      pUVar5 = (pointer)((long)paVar4 + 0x28);
      paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)((long)paVar4 + 0x38);
    } while (pUVar5 != pUVar1);
    pUVar5 = (this->m_uniforms).
             super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  if (pUVar5 != (pointer)0x0) {
    operator_delete(pUVar5,(long)(this->m_uniforms).
                                 super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pUVar5);
    return;
  }
  return;
}

Assistant:

~UniformCollection	(void)
	{
		for (int i = 0; i < (int)m_structTypes.size(); i++)
			delete m_structTypes[i];
	}